

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O3

bool __thiscall Incppect<true>::Impl::hasExt(Impl *this,string_view file,string_view ext)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  
  uVar2 = ext._M_len;
  if (file._M_len < uVar2) {
    bVar4 = false;
  }
  else {
    if (uVar2 == 0) {
      return true;
    }
    lVar3 = -1;
    do {
      bVar4 = ext._M_str[lVar3 + uVar2] == file._M_str[lVar3 + file._M_len];
      if (!bVar4) {
        return bVar4;
      }
      uVar1 = -lVar3;
      lVar3 = lVar3 + -1;
    } while (uVar1 != uVar2);
  }
  return bVar4;
}

Assistant:

inline bool hasExt(std::string_view file, std::string_view ext) {
        if (ext.size() > file.size()) {
            return false;
        }
        return std::equal(ext.rbegin(), ext.rend(), file.rbegin());
    }